

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

void VP8LCollectColorRedTransforms_C
               (uint32_t *argb,int stride,int tile_width,int tile_height,int green_to_red,
               uint32_t *histo)

{
  bool bVar1;
  ulong uVar2;
  
  if (0 < tile_height) {
    do {
      if (0 < tile_width) {
        uVar2 = 0;
        do {
          histo[(argb[uVar2] >> 0x10) -
                ((uint)((int)(char)(argb[uVar2] >> 8) * (int)(char)green_to_red) >> 5) & 0xff] =
               histo[(argb[uVar2] >> 0x10) -
                     ((uint)((int)(char)(argb[uVar2] >> 8) * (int)(char)green_to_red) >> 5) & 0xff]
               + 1;
          uVar2 = uVar2 + 1;
        } while ((uint)tile_width != uVar2);
      }
      argb = argb + stride;
      bVar1 = 1 < tile_height;
      tile_height = tile_height + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void VP8LCollectColorRedTransforms_C(const uint32_t* WEBP_RESTRICT argb,
                                     int stride,
                                     int tile_width, int tile_height,
                                     int green_to_red, uint32_t histo[]) {
  while (tile_height-- > 0) {
    int x;
    for (x = 0; x < tile_width; ++x) {
      ++histo[TransformColorRed((uint8_t)green_to_red, argb[x])];
    }
    argb += stride;
  }
}